

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 VmJsonTokenize(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)

{
  byte bVar1;
  byte *pbVar2;
  sxi32 sVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  sxu32 sVar8;
  uint uVar9;
  byte *pbVar10;
  int local_38;
  
  pbVar5 = pStream->zText;
  pbVar2 = pStream->zEnd;
  pbVar10 = pbVar5;
  while( true ) {
    if (pbVar2 <= pbVar5) {
      return -0x12;
    }
    bVar1 = *pbVar5;
    if ((0xbf < (ulong)bVar1) ||
       (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 0x20) == 0))
    break;
    if (bVar1 == 10) {
      pStream->nLine = pStream->nLine + 1;
    }
    pbVar5 = pbVar5 + 1;
    pStream->zText = pbVar5;
    pbVar10 = pbVar10 + 1;
  }
  sVar8 = pStream->nLine;
  pToken->nLine = sVar8;
  pToken->pUserData = (void *)0x0;
  (pToken->sData).zString = (char *)pbVar5;
  (pToken->sData).nByte = 0;
  bVar1 = *pbVar5;
  uVar7 = (ulong)bVar1;
  local_38 = (int)pbVar10;
  pbVar10 = pbVar5;
  if (0xbf < uVar7) goto LAB_0012854a;
  ppuVar4 = __ctype_b_loc();
  if ((uVar7 == 0x5f) || (((*ppuVar4)[uVar7] & 0x400) != 0)) {
    pbVar6 = pbVar5 + 1;
    do {
      pStream->zText = pbVar6;
      pbVar10 = pbVar6;
LAB_0012854a:
      pbVar6 = pbVar10;
      if (0xbf < *pbVar10) {
        pbVar6 = pbVar10 + 1;
      }
      while (((pbVar6 < pbVar2 && (uVar7 = (ulong)*pbVar6, uVar7 < 0xc0)) &&
             ((ppuVar4 = __ctype_b_loc(), uVar7 == 0x5f || (((*ppuVar4)[uVar7] & 8) != 0))))) {
        pbVar6 = pbVar6 + 1;
      }
    } while (pbVar6 != pbVar10);
    uVar9 = (int)pbVar10 - local_38;
    (pToken->sData).nByte = uVar9;
    pToken->nType = 0x800;
    if ((uVar9 == 4) && (sVar3 = SyStrnicmp((char *)pbVar5,"true",4), sVar3 == 0)) {
      pToken->nType = 1;
      return 0;
    }
    if (uVar9 == 4) {
      sVar3 = SyStrnicmp((char *)pbVar5,"null",4);
      if (sVar3 == 0) {
        pToken->nType = 8;
        return 0;
      }
      return 0;
    }
    if (uVar9 == 5) {
      sVar3 = SyStrnicmp((char *)pbVar5,"false",5);
      if (sVar3 == 0) {
        pToken->nType = 2;
        return 0;
      }
      return 0;
    }
    return 0;
  }
  if (uVar7 == 0x22) {
    pbVar5 = pbVar5 + 1;
    pStream->zText = pbVar5;
    (pToken->sData).zString = (char *)pbVar5;
    uVar9 = 0;
    do {
      if (pbVar2 <= pbVar5) {
        pToken->nType = 0x1000;
        *(undefined4 *)pUserData = 0xfffffff4;
        sVar8 = pToken->nType;
        (pToken->sData).nByte = uVar9;
        if (sVar8 != 4) {
          return 0;
        }
LAB_001284bb:
        (pToken->sData).nByte = uVar9 - 1;
        return 0;
      }
      if (*pbVar5 == 10) {
        sVar8 = sVar8 + 1;
        pStream->nLine = sVar8;
      }
      else if ((*pbVar5 == 0x22) && (pbVar5[-1] != 0x5c)) {
        pToken->nType = 4;
        pStream->zText = pbVar5 + 1;
        uVar9 = uVar9 + 1;
        goto LAB_001284bb;
      }
      pbVar5 = pbVar5 + 1;
      pStream->zText = pbVar5;
      uVar9 = uVar9 + 1;
    } while( true );
  }
  if (bVar1 == 0x2c) {
    sVar8 = 0x400;
  }
  else if (bVar1 == 0x3a) {
    sVar8 = 0x200;
  }
  else if (bVar1 == 0x5b) {
    sVar8 = 0x80;
  }
  else if (bVar1 == 0x5d) {
    sVar8 = 0x100;
  }
  else if (bVar1 == 0x7d) {
    sVar8 = 0x40;
  }
  else {
    if (bVar1 != 0x7b) {
      if (((((*ppuVar4)[uVar7] >> 0xb & 1) == 0) && (uVar7 != 0x2d)) && (bVar1 != 0x2b)) {
        pToken->nType = 0x1000;
        pStream->zText = pbVar5 + 1;
        *(undefined4 *)pUserData = 0xfffffff4;
        return -10;
      }
      pbVar5 = pbVar5 + 1;
      pStream->zText = pbVar5;
      pToken->nType = 0x10;
      while (pbVar10 = pbVar5, pbVar5 < pbVar2) {
        bVar1 = *pbVar5;
        if (0xbf < (ulong)bVar1) {
LAB_00128473:
          if ((bVar1 & 0xdf) == 0x45) {
            pbVar10 = pbVar5 + 1;
            pStream->zText = pbVar10;
            if (pbVar10 < pbVar2) {
              if ((*pbVar10 != 0x2b) && (*pbVar10 != 0x2d)) goto LAB_00128513;
              pbVar10 = pbVar5 + 2;
              while( true ) {
                pStream->zText = pbVar10;
LAB_00128513:
                if (((pbVar2 <= pbVar10) || (0xbf < (ulong)*pbVar10)) ||
                   ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar10 * 2 + 1) & 8) == 0)) break;
                pbVar10 = pbVar10 + 1;
              }
            }
          }
          break;
        }
        if ((*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 8) == 0) {
          if (bVar1 != 0x2e) goto LAB_00128473;
          goto LAB_00128411;
        }
        pbVar5 = pbVar5 + 1;
        pStream->zText = pbVar5;
      }
      goto LAB_001283d0;
    }
    sVar8 = 0x20;
  }
  pToken->nType = sVar8;
  pStream->zText = pbVar5 + 1;
  pbVar10 = pbVar5 + 1;
  goto LAB_001283d0;
  while( true ) {
    bVar1 = *pbVar10;
    if ((0xbf < (ulong)bVar1) ||
       (pbVar5 = pbVar10, (*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 8) == 0)) break;
LAB_00128411:
    pbVar6 = pbVar5;
    pbVar10 = pbVar6 + 1;
    pStream->zText = pbVar10;
    if (pbVar2 <= pbVar10) goto LAB_001283d0;
  }
  if ((bVar1 & 0xdf) == 0x45) {
    pbVar10 = pbVar6 + 2;
    pStream->zText = pbVar10;
    if (pbVar10 < pbVar2) {
      if ((*pbVar10 != 0x2b) && (*pbVar10 != 0x2d)) goto LAB_001284ec;
      pbVar10 = pbVar6 + 3;
      while( true ) {
        pStream->zText = pbVar10;
LAB_001284ec:
        if (((pbVar2 <= pbVar10) || (0xbf < (ulong)*pbVar10)) ||
           ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar10 * 2 + 1) & 8) == 0)) break;
        pbVar10 = pbVar10 + 1;
      }
    }
  }
LAB_001283d0:
  (pToken->sData).nByte = (int)pbVar10 - local_38;
  return 0;
}

Assistant:

static sxi32 VmJsonTokenize(SyStream *pStream, SyToken *pToken, void *pUserData, void *pCtxData)
{
	int *pJsonErr = (int *)pUserData;
	SyString *pStr;
	int c;
	/* Ignore leading white spaces */
	while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisSpace(pStream->zText[0]) ){
		/* Advance the stream cursor */
		if( pStream->zText[0] == '\n' ){
			/* Update line counter */
			pStream->nLine++;
		}
		pStream->zText++;
	}
	if( pStream->zText >= pStream->zEnd ){
		/* End of input reached */
		SXUNUSED(pCtxData); /* cc warning */
		return SXERR_EOF;
	}
	/* Record token starting position and line */
	pToken->nLine = pStream->nLine;
	pToken->pUserData = 0;
	pStr = &pToken->sData;
	SyStringInitFromBuf(pStr, pStream->zText, 0);
	if( pStream->zText[0] >= 0xc0 || SyisAlpha(pStream->zText[0]) || pStream->zText[0] == '_' ){
		/* The following code fragment is taken verbatim from the xPP source tree.
		 * xPP is a modern embeddable macro processor with advanced features useful for
		 * application seeking for a production quality, ready to use macro processor.
		 * xPP is a widely used library developed and maintened by Symisc Systems.
		 * You can reach the xPP home page by following this link:
		 * http://xpp.symisc.net/
		 */
		const unsigned char *zIn;
		/* Isolate UTF-8 or alphanumeric stream */
		if( pStream->zText[0] < 0xc0 ){
			pStream->zText++;
		}
		for(;;){
			zIn = pStream->zText;
			if( zIn[0] >= 0xc0 ){
				zIn++;
				/* UTF-8 stream */
				while( zIn < pStream->zEnd && ((zIn[0] & 0xc0) == 0x80) ){
					zIn++;
				}
			}
			/* Skip alphanumeric stream */
			while( zIn < pStream->zEnd && zIn[0] < 0xc0 && (SyisAlphaNum(zIn[0]) || zIn[0] == '_') ){
				zIn++;
			}
			if( zIn == pStream->zText ){
				/* Not an UTF-8 or alphanumeric stream */
				break;
			}
			/* Synchronize pointers */
			pStream->zText = zIn;
		}
		/* Record token length */
		pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		/* A simple identifier */
		pToken->nType = JSON_TK_ID;
		if( pStr->nByte == sizeof("true") -1 && SyStrnicmp(pStr->zString, "true", sizeof("true")-1) == 0 ){
			/* boolean true */
			pToken->nType = JSON_TK_TRUE;
		}else if( pStr->nByte == sizeof("false") -1 && SyStrnicmp(pStr->zString,"false", sizeof("false")-1) == 0 ){
			/* boolean false */
			pToken->nType = JSON_TK_FALSE;
		}else if( pStr->nByte == sizeof("null") -1 && SyStrnicmp(pStr->zString,"null", sizeof("null")-1) == 0 ){
			/* NULL */
			pToken->nType = JSON_TK_NULL;
		}
		return SXRET_OK;
	}
	if( pStream->zText[0] == '{' || pStream->zText[0] == '[' || pStream->zText[0] == '}' || pStream->zText[0] == ']'
		|| pStream->zText[0] == ':' || pStream->zText[0] == ',' ){
			/* Single character */
			c = pStream->zText[0];
			/* Set token type */
			switch(c){
			case '[': pToken->nType = JSON_TK_OSB;   break;
			case '{': pToken->nType = JSON_TK_OCB;   break;
			case '}': pToken->nType = JSON_TK_CCB;   break;
			case ']': pToken->nType = JSON_TK_CSB;   break;
			case ':': pToken->nType = JSON_TK_COLON; break;
			case ',': pToken->nType = JSON_TK_COMMA; break;
			default:
				break;
			}
			/* Advance the stream cursor */
			pStream->zText++;
	}else if( pStream->zText[0] == '"') {
		/* JSON string */
		pStream->zText++;
		pStr->zString++;
		/* Delimit the string */
		while( pStream->zText < pStream->zEnd ){
			if( pStream->zText[0] == '"' && pStream->zText[-1] != '\\' ){
				break;
			}
			if( pStream->zText[0] == '\n' ){
				/* Update line counter */
				pStream->nLine++;
			}
			pStream->zText++;
		}
		if( pStream->zText >= pStream->zEnd ){
			/* Missing closing '"' */
			pToken->nType = JSON_TK_INVALID;
			*pJsonErr = SXERR_SYNTAX;
		}else{
			pToken->nType = JSON_TK_STR;
			pStream->zText++; /* Jump the closing double quotes */
		}
	}else if( (pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]))
	        || pStream->zText[0] == '-' || pStream->zText[0] == '+' ){
		/* Number */
		pStream->zText++;
		pToken->nType = JSON_TK_NUM;
		while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
			pStream->zText++;
		}
		if( pStream->zText < pStream->zEnd ){
			c = pStream->zText[0];
			if( c == '.' ){
					/* Real number */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
						pStream->zText++;
					}
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c=='e' || c=='E' ){
							pStream->zText++;
							if( pStream->zText < pStream->zEnd ){
								c = pStream->zText[0];
								if( c =='+' || c=='-' ){
									pStream->zText++;
								}
								while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
									pStream->zText++;
								}
							}
						}
					}					
				}else if( c=='e' || c=='E' ){
					/* Real number */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c =='+' || c=='-' ){
							pStream->zText++;
						}
						while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
							pStream->zText++;
						}
					}					
				}
			}
	}else{
		/* Unexpected token */
		pToken->nType = JSON_TK_INVALID;
		/* Advance the stream cursor */
		pStream->zText++;
		*pJsonErr = SXERR_SYNTAX;
		/* Abort processing immediatley */
		return SXERR_ABORT;
	}
	/* record token length */
	pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
	if( pToken->nType == JSON_TK_STR ){
		pStr->nByte--;
	}
	/* Return to the lexer */
	return SXRET_OK;
}